

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint64_t *t;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_58;
  
  local_58.x.n[0] = *(uint64_t *)pubkey->data;
  local_58.x.n[1] = *(uint64_t *)(pubkey->data + 8);
  local_58.x.n[2] = *(uint64_t *)(pubkey->data + 0x10);
  local_58.x.n[3] = *(uint64_t *)(pubkey->data + 0x18);
  local_58.y.n[0] = *(uint64_t *)(pubkey->data + 0x20);
  local_58.y.n[1] = *(uint64_t *)(pubkey->data + 0x28);
  local_58.y.n[2] = *(uint64_t *)(pubkey->data + 0x30);
  local_58.y.n[3] = *(uint64_t *)(pubkey->data + 0x38);
  secp256k1_ge_from_storage(ge,&local_58);
  bVar4 = (ge->x).n[3] == 0;
  bVar5 = (ge->x).n[1] == 0;
  bVar2 = (ge->x).n[2] == 0;
  bVar3 = (ge->x).n[0] == 0;
  bVar1 = (ge->x).n[4] == 0;
  if (((bVar4 && bVar5) && (bVar2 && bVar3)) && bVar1) {
    secp256k1_pubkey_load_cold_1();
  }
  return (uint)(((!bVar4 || !bVar5) || (!bVar2 || !bVar3)) || !bVar1);
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    secp256k1_ge_from_bytes(ge, pubkey->data);
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}